

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O0

UTFstring * __thiscall libebml::UTFstring::operator=(UTFstring *this,wchar_t *_aBuf)

{
  undefined1 auVar1 [16];
  wchar_t *pwVar2;
  ulong uVar3;
  size_t local_28;
  size_t aLen;
  wchar_t *_aBuf_local;
  UTFstring *this_local;
  
  if (this->_Data != (wchar_t *)0x0) {
    operator_delete__(this->_Data);
  }
  if (_aBuf == (wchar_t *)0x0) {
    pwVar2 = (wchar_t *)operator_new__(4);
    this->_Data = pwVar2;
    *this->_Data = L'\0';
    UpdateFromUCS2(this);
  }
  else {
    for (local_28 = 0; _aBuf[local_28] != L'\0'; local_28 = local_28 + 1) {
    }
    this->_Length = local_28;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->_Length + 1;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pwVar2 = (wchar_t *)operator_new__(uVar3);
    this->_Data = pwVar2;
    for (local_28 = 0; _aBuf[local_28] != L'\0'; local_28 = local_28 + 1) {
      this->_Data[local_28] = _aBuf[local_28];
    }
    this->_Data[local_28] = L'\0';
    UpdateFromUCS2(this);
  }
  return this;
}

Assistant:

UTFstring & UTFstring::operator=(const wchar_t * _aBuf)
{
  delete [] _Data;
  if (_aBuf == NULL) {
    _Data = new wchar_t[1];
    _Data[0] = 0;
    UpdateFromUCS2();
    return *this;
  }

  size_t aLen;
  for (aLen=0; _aBuf[aLen] != 0; aLen++);
  _Length = aLen;
  _Data = new wchar_t[_Length+1];
  for (aLen=0; _aBuf[aLen] != 0; aLen++) {
    _Data[aLen] = _aBuf[aLen];
  }
  _Data[aLen] = 0;
  UpdateFromUCS2();
  return *this;
}